

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfscursor.cpp
# Opt level: O1

void __thiscall QEglFSCursor::changeCursor(QEglFSCursor *this,QCursor *cursor,QWindow *window)

{
  bool bVar1;
  long in_FS_OFFSET;
  QRect local_48;
  QRect local_38;
  QRect local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.x1.m_i = *(int *)(this + 0x60) - *(int *)(this + 0x40);
  local_28.x2.m_i = *(int *)(this + 0x38) + local_28.x1.m_i + -1;
  local_28.y1.m_i = *(int *)(this + 100) - *(int *)(this + 0x44);
  local_28.y2.m_i = *(int *)(this + 0x3c) + (*(int *)(this + 100) - *(int *)(this + 0x44)) + -1;
  bVar1 = setCurrentCursor(this,cursor);
  if (bVar1) {
    local_48.x1.m_i = *(int *)(this + 0x60) - *(int *)(this + 0x40);
    local_48.x2.m_i = *(int *)(this + 0x38) + local_48.x1.m_i + -1;
    local_48.y1.m_i = *(int *)(this + 100) - *(int *)(this + 0x44);
    local_48.y2.m_i = *(int *)(this + 0x3c) + (*(int *)(this + 100) - *(int *)(this + 0x44)) + -1;
    local_38 = (QRect)QRect::operator|(&local_28,&local_48);
    update(this,&local_38,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSCursor::changeCursor(QCursor *cursor, QWindow *window)
{
    Q_UNUSED(window);
    const QRect oldCursorRect = cursorRect();
    if (setCurrentCursor(cursor))
        update(oldCursorRect | cursorRect(), false);
}